

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_spherical_quadrature.hpp
# Opt level: O0

void __thiscall
IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::
RadialGridPartition<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&>
          (RadialGridPartition<IntegratorXX::LebedevLaikov<double>> *this,
          RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
          *rq,size_t idx,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q,unsigned_long *args,
          LebedevLaikov<double> *args_1,unsigned_long *args_2,LebedevLaikov<double> *args_3,
          unsigned_long *args_4,LebedevLaikov<double> *args_5)

{
  LebedevLaikov<double> *args_local_1;
  unsigned_long *args_local;
  Quadrature<IntegratorXX::LebedevLaikov<double>_> *q_local;
  size_t idx_local;
  RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
  *rq_local;
  RadialGridPartition<IntegratorXX::LebedevLaikov<double>_> *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  std::
  vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>_>_>_>
  ::vector((vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>_>_>_>
            *)(this + 0x18));
  add_quads<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&>
            (this,rq,idx,q,args,args_1,args_2,args_3,args_4,args_5);
  return;
}

Assistant:

RadialGridPartition( const RadialQuad& rq, size_t idx, 
                       const Quadrature<AngularQuad>& q, Args&&... args ) {
    add_quads( rq, idx, q, std::forward<Args>(args)... );
  }